

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

bool gguf_read_emplace_helper<unsigned_short>
               (gguf_reader *gr,vector<gguf_kv,_std::allocator<gguf_kv>_> *kv,string *key,
               bool is_array,size_t n)

{
  bool bVar1;
  byte in_CL;
  unsigned_short value_1;
  length_error *anon_var_0;
  bad_alloc *anon_var_0_1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> value;
  unsigned_short *in_stack_ffffffffffffff68;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  vector<gguf_kv,_std::allocator<gguf_kv>_> *in_stack_ffffffffffffff80;
  gguf_reader *this;
  gguf_reader local_48 [4];
  byte local_21;
  byte local_1;
  
  local_21 = in_CL & 1;
  if (local_21 == 0) {
    bVar1 = gguf_reader::read<unsigned_short>
                      ((gguf_reader *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (!bVar1) {
      local_1 = 0;
      goto LAB_00193118;
    }
    std::vector<gguf_kv,std::allocator<gguf_kv>>::
    emplace_back<std::__cxx11::string_const&,unsigned_short&>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               (unsigned_short *)in_stack_ffffffffffffff70);
  }
  else {
    this = local_48;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x192f53);
    bVar1 = gguf_reader::read<unsigned_short>
                      (this,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
    if (bVar1) {
      std::vector<gguf_kv,std::allocator<gguf_kv>>::
      emplace_back<std::__cxx11::string_const&,std::vector<unsigned_short,std::allocator<unsigned_short>>&>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    }
    else {
      local_1 = 0;
    }
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_ffffffffffffff80)
    ;
    if (!bVar1) goto LAB_00193118;
  }
  local_1 = 1;
LAB_00193118:
  return (bool)(local_1 & 1);
}

Assistant:

bool gguf_read_emplace_helper(const struct gguf_reader & gr, std::vector<struct gguf_kv> & kv, const std::string & key, const bool is_array, const size_t n) {
    if (is_array) {
        std::vector<T> value;
        try {
            if (!gr.read(value, n)) {
                return false;
            }
        } catch (std::length_error &) {
            fprintf(stderr, "%s: encountered length_error while reading value for key '%s'\n", __func__, key.c_str());
            return false;
        } catch (std::bad_alloc &) {
            fprintf(stderr, "%s: encountered bad_alloc error while reading value for key '%s'\n", __func__, key.c_str());
            return false;
        }
        kv.emplace_back(key, value);
    } else {
        T value;
        if (!gr.read(value)) {
            return false;
        }
        kv.emplace_back(key, value);
    }
    return true;
}